

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

void __thiscall features::Surf::descriptor_assignment(Surf *this)

{
  pointer pDVar1;
  pointer pKVar2;
  bool bVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  undefined1 local_148 [8];
  Descriptor descr;
  
  descr.data.v._248_8_ = &this->descriptors;
  pDVar1 = (this->descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->descriptors).
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar1) {
    (this->descriptors).
    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar1;
  }
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::reserve
            ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             descr.data.v._248_8_,
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar4 = 0xc;
  for (uVar5 = 0;
      pKVar2 = (this->keypoints).
               super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->keypoints).
                            super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar2 >> 4);
      uVar5 = uVar5 + 1) {
    local_148._0_4_ = *(float *)((long)pKVar2 + lVar4 + -4);
    local_148._4_4_ = *(float *)((long)&pKVar2->octave + lVar4);
    descr.x = ((float)(*(int *)((anonymous_namespace)::kernel_sizes +
                               (long)(int)(*(float *)((long)pKVar2 + lVar4 + -8) + 0.5) * 4 +
                               (long)*(int *)((long)pKVar2 + lVar4 + -0xc) * 0x10) * 3) * 1.2) / 9.0
    ;
    bVar3 = descriptor_orientation(this,(Descriptor *)local_148);
    if (bVar3) {
      bVar3 = descriptor_computation
                        (this,(Descriptor *)local_148,(this->options).use_upright_descriptor);
      if (bVar3) {
        std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
        push_back((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *
                  )descr.data.v._248_8_,(Descriptor *)local_148);
      }
    }
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void
Surf::descriptor_assignment (void)
{
    this->descriptors.clear();
    this->descriptors.reserve(keypoints.size());
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint const& kp = this->keypoints[i];

        /* Copy over the basic information to the descriptor. */
        Descriptor descr;
        descr.x = kp.x;
        descr.y = kp.y;

        /*
         * The scale is obtained from the filter size. The smallest filter in
         * SURF has size 9 and corresponds to a scale of 1.2. Thus, the
         * scale of a filter with size X has a scale of X * 1.2 / 9.
         */
        int sample = static_cast<int>(kp.sample + 0.5f);
        descr.scale = 3 * kernel_sizes[kp.octave][sample] * 1.2f / 9.0f;

        /* Find the orientation of the keypoint. */
        if (!this->descriptor_orientation(&descr))
            continue;

        /* Compute descriptor relative to orientation. */
        if (!this->descriptor_computation(&descr,
            this->options.use_upright_descriptor))
            continue;

        this->descriptors.push_back(descr);
    }
}